

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O3

TemplateCache * __thiscall ctemplate::TemplateCache::Clone(TemplateCache *this)

{
  int iVar1;
  TemplateCache *this_00;
  _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *__ht;
  __node_base *p_Var2;
  ReaderMutexLock ml;
  ReaderMutexLock local_20;
  
  local_20.mu_ = this->mutex_;
  if (((pthread_rwlock_t *)((long)local_20.mu_ + 0x38))->__size[0] == '\x01') {
    iVar1 = pthread_rwlock_rdlock((pthread_rwlock_t *)local_20.mu_);
    if (iVar1 != 0) {
      abort();
    }
  }
  this_00 = (TemplateCache *)operator_new(0x40);
  TemplateCache(this_00);
  __ht = &this->parsed_template_cache_->_M_h;
  if (__ht != &this_00->parsed_template_cache_->_M_h) {
    std::
    _Hashtable<std::pair<unsigned_long,int>,std::pair<std::pair<unsigned_long,int>const,ctemplate::TemplateCache::CachedTemplate>,std::allocator<std::pair<std::pair<unsigned_long,int>const,ctemplate::TemplateCache::CachedTemplate>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_long,int>>,ctemplate::TemplateCache::TemplateCacheHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::pair<unsigned_long,int>,std::pair<std::pair<unsigned_long,int>const,ctemplate::TemplateCache::CachedTemplate>,std::allocator<std::pair<std::pair<unsigned_long,int>const,ctemplate::TemplateCache::CachedTemplate>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_long,int>>,ctemplate::TemplateCache::TemplateCacheHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::pair<unsigned_long,int>,std::pair<std::pair<unsigned_long,int>const,ctemplate::TemplateCache::CachedTemplate>,std::allocator<std::pair<std::pair<unsigned_long,int>const,ctemplate::TemplateCache::CachedTemplate>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_long,int>>,ctemplate::TemplateCache::TemplateCacheHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this_00->parsed_template_cache_->_M_h,__ht);
    __ht = &this->parsed_template_cache_->_M_h;
  }
  p_Var2 = &__ht->_M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    RefcountedTemplate::IncRef((RefcountedTemplate *)p_Var2[3]._M_nxt);
  }
  ReaderMutexLock::~ReaderMutexLock(&local_20);
  return this_00;
}

Assistant:

TemplateCache* TemplateCache::Clone() const {
  ReaderMutexLock ml(mutex_);
  TemplateCache* new_cache = new TemplateCache();
  *(new_cache->parsed_template_cache_) = *parsed_template_cache_;
  for (TemplateMap::iterator it = parsed_template_cache_->begin();
       it != parsed_template_cache_->end(); ++it) {
    it->second.refcounted_tpl->IncRef();
  }

  return new_cache;
}